

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O3

void mdiffwrite(memfile *mf,void *buf,uint bytes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  
  uVar2 = mf->difflen;
  iVar3 = mf->diffpos;
  uVar1 = iVar3 + bytes;
  if (uVar2 < uVar1) {
    uVar5 = uVar2 + 0x1000;
    if (uVar2 + 0x1000 < uVar1) {
      uVar5 = uVar1;
    }
    iVar3 = uVar2 + (~uVar2 + uVar5 & 0xfffff000) + 0x1000;
    mf->difflen = iVar3;
    pcVar4 = (char *)realloc(mf->diffbuf,(long)iVar3);
    mf->diffbuf = pcVar4;
    iVar3 = mf->diffpos;
  }
  else {
    pcVar4 = mf->diffbuf;
  }
  memcpy(pcVar4 + iVar3,buf,(ulong)bytes);
  mf->diffpos = mf->diffpos + bytes;
  return;
}

Assistant:

static void mdiffwrite(struct memfile *mf, const void *buf, unsigned int bytes)
{
	boolean do_realloc = FALSE;
	while (mf->difflen < mf->diffpos + bytes) {
	    mf->difflen += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->diffbuf = realloc(mf->diffbuf, mf->difflen);
	memcpy(&mf->diffbuf[mf->diffpos], buf, bytes);
	mf->diffpos += bytes;
}